

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.cpp
# Opt level: O0

void __thiscall
indigox::algorithm::AStarOptimisation::CalculateHeuristicEnergy
          (AStarOptimisation *this,p_AStarQueueItem *d)

{
  element_type *peVar1;
  p_AStarQueueItem *in_stack_000000e8;
  AStarOptimisation *in_stack_000000f0;
  p_AStarQueueItem *in_stack_00000428;
  AStarOptimisation *in_stack_00000430;
  shared_ptr<indigox::algorithm::AStarQueueItem> *in_stack_ffffffffffffff98;
  shared_ptr<indigox::algorithm::AStarQueueItem> *in_stack_ffffffffffffffa0;
  shared_ptr<indigox::algorithm::AStarQueueItem> local_40 [4];
  
  if (Options::AssignElectrons::AStar::HEURISTIC == PROMISCUOUS) {
    std::shared_ptr<indigox::algorithm::AStarQueueItem>::shared_ptr
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    PromiscuousHeuristic(in_stack_000000f0,in_stack_000000e8);
    std::shared_ptr<indigox::algorithm::AStarQueueItem>::~shared_ptr
              ((shared_ptr<indigox::algorithm::AStarQueueItem> *)0x13e568);
  }
  else if (Options::AssignElectrons::AStar::HEURISTIC == ABSTEMIOUS) {
    std::shared_ptr<indigox::algorithm::AStarQueueItem>::shared_ptr
              (local_40,in_stack_ffffffffffffff98);
    AbstemiousHeuristic(in_stack_00000430,in_stack_00000428);
    std::shared_ptr<indigox::algorithm::AStarQueueItem>::~shared_ptr
              ((shared_ptr<indigox::algorithm::AStarQueueItem> *)0x13e5c2);
  }
  else {
    peVar1 = std::
             __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x13e5e8);
    peVar1->heuristic_cost = 0;
  }
  return;
}

Assistant:

void AStarOptimisation::CalculateHeuristicEnergy(p_AStarQueueItem d) {
  if (opt_as::HEURISTIC == opt_as::Heuristic::PROMISCUOUS)
    PromiscuousHeuristic(d);
  else if (opt_as::HEURISTIC == opt_as::Heuristic::ABSTEMIOUS)
    AbstemiousHeuristic(d);
  else
    d->heuristic_cost = 0;
}